

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O3

int __thiscall xercesc_4_0::DOMAttrMapImpl::findNamePoint(DOMAttrMapImpl *this,XMLCh *name)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  if (this->fNodes == (DOMNodeVector *)0x0) {
    uVar2 = 0xffffffff;
  }
  else {
    iVar4 = (int)this->fNodes->nextFreeSlot;
    if (iVar4 < 1) {
      uVar2 = 0;
      uVar3 = 0;
    }
    else {
      iVar4 = iVar4 + -1;
      uVar3 = 0;
      do {
        uVar2 = uVar3 + iVar4 >> 1;
        iVar1 = (*this->fNodes->data[uVar2]->_vptr_DOMNode[2])();
        iVar1 = XMLString::compareString(name,(XMLCh *)CONCAT44(extraout_var,iVar1));
        if (iVar1 == 0) {
          return uVar2;
        }
        if (iVar1 < 0) {
          iVar4 = uVar2 - 1;
        }
        else {
          uVar3 = uVar2 + 1;
        }
      } while ((int)uVar3 <= iVar4);
    }
    if ((int)uVar2 < (int)uVar3) {
      uVar2 = uVar3;
    }
    uVar2 = ~uVar2;
  }
  return uVar2;
}

Assistant:

int DOMAttrMapImpl::findNamePoint(const XMLCh *name) const
{
    // Binary search
    int i=0;
    if(fNodes!=0)
    {
        int first=0,last=(int)fNodes->size()-1;

        while(first<=last)
        {
            i=(first+last)/2;
            int test = XMLString::compareString(name, fNodes->elementAt(i)->getNodeName());
            if(test==0)
                return i; // Name found
            else if(test<0)
                last=i-1;
            else
                first=i+1;
        }
        if(first>i) i=first;
    }
    /********************
    // Linear search
    int i = 0;
    if (fNodes != 0)
    for (i = 0; i < fNodes.size(); ++i)
    {
    int test = name.compareTo(((NodeImpl *) (fNodes.elementAt(i))).getNodeName());
    if (test == 0)
    return i;
    else
    if (test < 0)
    {
    break; // Found insertpoint
    }
    }

    *******************/
    return -1 - i; // not-found has to be encoded.
}